

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_init_tile_thread_data(AV1_PRIMARY *ppi,int is_first_pass)

{
  aom_internal_error_info *info;
  BLOCK_SIZE BVar1;
  int iVar2;
  EncWorkerData *pEVar3;
  AV1_COMP *pAVar4;
  int iVar5;
  ThreadData_conflict *td;
  CONV_BUF_TYPE *pCVar6;
  PICK_MODE_CONTEXT *pPVar7;
  uint32_t *puVar8;
  FRAME_COUNTS *pFVar9;
  PALETTE_BUFFER *pPVar10;
  int32_t *piVar11;
  uint8_t *puVar12;
  int16_t *piVar13;
  PixelLevelGradientInfo *pPVar14;
  Block4x4VarInfo *pBVar15;
  VP64x64 *pVVar16;
  FRAME_CONTEXT *pFVar17;
  PrimaryMultiThreadInfo *pPVar18;
  int y;
  long lVar19;
  size_t size;
  long lVar20;
  long lVar21;
  uint32_t *(*papuVar22) [2];
  long lVar23;
  bool bVar24;
  
  lVar20 = (long)(ppi->p_mt_info).num_workers;
  pPVar18 = (PrimaryMultiThreadInfo *)((ppi->p_mt_info).num_mod_workers + 4);
  if (1 < (ppi->p_mt_info).num_mod_workers[10]) {
    pPVar18 = &ppi->p_mt_info;
  }
  iVar2 = pPVar18->num_workers;
  if (0 < lVar20) {
    info = &ppi->error;
    do {
      lVar21 = lVar20 + -1;
      pEVar3 = (ppi->p_mt_info).tile_thr_data;
      if (lVar20 != 1) {
        td = (ThreadData_conflict *)aom_memalign(0x20,0x26e60);
        if (td == (ThreadData_conflict *)0x0) {
          aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate td");
        }
        memset(td,0,0x26e60);
        pEVar3[lVar21].td = td;
        pEVar3[lVar21].original_td = td;
        av1_setup_shared_coeff_buffer(&ppi->seq_params,&td->shared_coeff_buf,info);
        pCVar6 = (CONV_BUF_TYPE *)aom_memalign(0x20,0x8000);
        td->tmp_conv_dst = pCVar6;
        if (pCVar6 == (CONV_BUF_TYPE *)0x0) {
          aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate td->tmp_conv_dst");
        }
        if (lVar20 <= (ppi->p_mt_info).num_mod_workers[0]) {
          pPVar7 = av1_alloc_pmc(ppi->cpi,BLOCK_16X16,&td->shared_coeff_buf);
          td->firstpass_ctx = pPVar7;
          if (pPVar7 == (PICK_MODE_CONTEXT *)0x0) {
            aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        if ((is_first_pass == 0) && (lVar20 <= iVar2)) {
          iVar5 = av1_setup_sms_tree(ppi->cpi,td);
          if (iVar5 != 0) {
            aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate SMS tree");
          }
          papuVar22 = td->hash_value_buffer;
          lVar23 = 0;
          do {
            lVar19 = 0;
            do {
              puVar8 = (uint32_t *)aom_malloc(0x4000);
              (*papuVar22)[lVar19] = puVar8;
              if (puVar8 == (uint32_t *)0x0) {
                aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate td->hash_value_buffer[x][y]");
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 == 1);
            papuVar22 = papuVar22 + 1;
            bVar24 = lVar23 == 0;
            lVar23 = lVar23 + 1;
          } while (bVar24);
          pFVar9 = (FRAME_COUNTS *)aom_calloc(1,0xc0);
          td->counts = pFVar9;
          if (pFVar9 == (FRAME_COUNTS *)0x0) {
            aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate td->counts");
          }
          pPVar10 = (PALETTE_BUFFER *)aom_memalign(0x10,0x5000);
          td->palette_buffer = pPVar10;
          if (pPVar10 == (PALETTE_BUFFER *)0x0) {
            aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate td->palette_buffer");
          }
          if ((ppi->cpi->oxcf).kf_cfg.key_freq_max != 0) {
            piVar11 = (int32_t *)aom_memalign(0x10,0x10000);
            (td->obmc_buffer).wsrc = piVar11;
            if (piVar11 == (int32_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->wsrc");
            }
            piVar11 = (int32_t *)aom_memalign(0x10,0x10000);
            (td->obmc_buffer).mask = piVar11;
            if (piVar11 == (int32_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->mask");
            }
            puVar12 = (uint8_t *)aom_memalign(0x10,0xc000);
            (td->obmc_buffer).above_pred = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate obmc_buffer->above_pred");
            }
            puVar12 = (uint8_t *)aom_memalign(0x10,0xc000);
            (td->obmc_buffer).left_pred = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate obmc_buffer->left_pred");
            }
            puVar12 = (uint8_t *)aom_memalign(0x10,0x8000);
            (td->comp_rd_buffer).pred0 = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred0");
            }
            puVar12 = (uint8_t *)aom_memalign(0x10,0x8000);
            (td->comp_rd_buffer).pred1 = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred1");
            }
            piVar13 = (int16_t *)aom_memalign(0x20,0x8000);
            (td->comp_rd_buffer).residual1 = piVar13;
            if (piVar13 == (int16_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->residual1");
            }
            piVar13 = (int16_t *)aom_memalign(0x20,0x8000);
            (td->comp_rd_buffer).diff10 = piVar13;
            if (piVar13 == (int16_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->diff10");
            }
            puVar12 = (uint8_t *)aom_malloc(0x8000);
            (td->comp_rd_buffer).tmp_best_mask_buf = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate bufs->tmp_best_mask_buf");
            }
            lVar23 = 0;
            do {
              puVar12 = (uint8_t *)aom_memalign(0x20,0x18000);
              td->tmp_pred_bufs[lVar23] = puVar12;
              if (puVar12 == (uint8_t *)0x0) {
                aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate td->tmp_pred_bufs[j]");
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 == 1);
          }
          pAVar4 = ppi->cpi;
          if ((((((pAVar4->common).current_frame.frame_type & 0xfd) == 0) &&
               ((pAVar4->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
              ((pAVar4->sf).part_sf.partition_search_type == '\0')) &&
             (((pAVar4->sf).intra_sf.intra_pruning_with_hog != 0 ||
              ((pAVar4->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))) {
            pPVar14 = (PixelLevelGradientInfo *)
                      aom_malloc((ulong)(uint)((int)(2L >> ((ppi->seq_params).monochrome & 0x3f)) <<
                                              0x10));
            td->pixel_gradient_info = pPVar14;
            if (pPVar14 == (PixelLevelGradientInfo *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->pixel_gradient_info");
            }
          }
          pAVar4 = ppi->cpi;
          if (((pAVar4->oxcf).mode == '\x02') &&
             (((pAVar4->sf).part_sf.partition_search_type == '\0' ||
              ((0.0 < (double)(pAVar4->oxcf).speed * -0.25 + 1.0 &&
               (((pAVar4->sf).rt_sf.use_nonrd_pick_mode == 0 ||
                ((pAVar4->sf).rt_sf.hybrid_intra_pickmode != 0)))))))) {
            BVar1 = ((pAVar4->common).seq_params)->sb_size;
            pBVar15 = (Block4x4VarInfo *)
                      aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                               [BVar1] *
                                         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                               [BVar1] * 0x10));
            td->src_var_info_of_4x4_sub_blocks = pBVar15;
            if (pBVar15 == (Block4x4VarInfo *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->src_var_info_of_4x4_sub_blocks");
            }
          }
          if ((ppi->cpi->sf).part_sf.partition_search_type == '\x02') {
            size = 0x2aa40;
            if ((ppi->seq_params).sb_size == BLOCK_64X64) {
              size = 0xaa90;
            }
            pVVar16 = (VP64x64 *)aom_malloc(size);
            td->vt64x64 = pVVar16;
            if (pVVar16 == (VP64x64 *)0x0) {
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate td->vt64x64");
            }
          }
        }
      }
      if (((is_first_pass == 0) && ((ppi->cpi->oxcf).row_mt == true)) && (lVar20 <= iVar2)) {
        if (lVar21 == 0) {
          if (0 < ppi->num_fp_contexts) {
            lVar23 = 0;
            do {
              pFVar17 = (FRAME_CONTEXT *)aom_memalign(0x10,0x52fc);
              (ppi->parallel_cpi[lVar23]->td).tctx = pFVar17;
              if ((ppi->parallel_cpi[lVar23]->td).tctx == (FRAME_CONTEXT *)0x0) {
                aom_internal_error(info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate ppi->parallel_cpi[j]->td.tctx");
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < ppi->num_fp_contexts);
          }
        }
        else {
          pFVar17 = (FRAME_CONTEXT *)aom_memalign(0x10,0x52fc);
          (pEVar3[lVar21].td)->tctx = pFVar17;
          if (pFVar17 == (FRAME_CONTEXT *)0x0) {
            aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate thread_data->td->tctx");
          }
        }
      }
      bVar24 = 1 < lVar20;
      lVar20 = lVar21;
    } while (bVar24);
  }
  (ppi->p_mt_info).prev_num_enc_workers = iVar2;
  return;
}

Assistant:

void av1_init_tile_thread_data(AV1_PRIMARY *ppi, int is_first_pass) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;

  assert(p_mt_info->workers != NULL);
  assert(p_mt_info->tile_thr_data != NULL);

  int num_workers = p_mt_info->num_workers;
  int num_enc_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_ENC);
  assert(num_enc_workers <= num_workers);
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[i];

    if (i > 0) {
      // Allocate thread data.
      ThreadData *td;
      AOM_CHECK_MEM_ERROR(&ppi->error, td, aom_memalign(32, sizeof(*td)));
      av1_zero(*td);
      thread_data->original_td = thread_data->td = td;

      // Set up shared coeff buffers.
      av1_setup_shared_coeff_buffer(&ppi->seq_params, &td->shared_coeff_buf,
                                    &ppi->error);
      AOM_CHECK_MEM_ERROR(&ppi->error, td->tmp_conv_dst,
                          aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE *
                                               sizeof(*td->tmp_conv_dst)));

      if (i < p_mt_info->num_mod_workers[MOD_FP]) {
        // Set up firstpass PICK_MODE_CONTEXT.
        td->firstpass_ctx =
            av1_alloc_pmc(ppi->cpi, BLOCK_16X16, &td->shared_coeff_buf);
        if (!td->firstpass_ctx)
          aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }

      if (!is_first_pass && i < num_enc_workers) {
        // Set up sms_tree.
        if (av1_setup_sms_tree(ppi->cpi, td)) {
          aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate SMS tree");
        }

        for (int x = 0; x < 2; x++)
          for (int y = 0; y < 2; y++)
            AOM_CHECK_MEM_ERROR(
                &ppi->error, td->hash_value_buffer[x][y],
                (uint32_t *)aom_malloc(AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
                                       sizeof(*td->hash_value_buffer[0][0])));

        // Allocate frame counters in thread data.
        AOM_CHECK_MEM_ERROR(&ppi->error, td->counts,
                            aom_calloc(1, sizeof(*td->counts)));

        // Allocate buffers used by palette coding mode.
        AOM_CHECK_MEM_ERROR(&ppi->error, td->palette_buffer,
                            aom_memalign(16, sizeof(*td->palette_buffer)));

        // The buffers 'tmp_pred_bufs[]', 'comp_rd_buffer' and 'obmc_buffer' are
        // used in inter frames to store intermediate inter mode prediction
        // results and are not required for allintra encoding mode. Hence, the
        // memory allocations for these buffers are avoided for allintra
        // encoding mode.
        if (ppi->cpi->oxcf.kf_cfg.key_freq_max != 0) {
          alloc_obmc_buffers(&td->obmc_buffer, &ppi->error);

          alloc_compound_type_rd_buffers(&ppi->error, &td->comp_rd_buffer);

          for (int j = 0; j < 2; ++j) {
            AOM_CHECK_MEM_ERROR(
                &ppi->error, td->tmp_pred_bufs[j],
                aom_memalign(32, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                                     sizeof(*td->tmp_pred_bufs[j])));
          }
        }

        if (is_gradient_caching_for_hog_enabled(ppi->cpi)) {
          const int plane_types = PLANE_TYPES >> ppi->seq_params.monochrome;
          AOM_CHECK_MEM_ERROR(&ppi->error, td->pixel_gradient_info,
                              aom_malloc(sizeof(*td->pixel_gradient_info) *
                                         plane_types * MAX_SB_SQUARE));
        }

        if (is_src_var_for_4x4_sub_blocks_caching_enabled(ppi->cpi)) {
          const BLOCK_SIZE sb_size = ppi->cpi->common.seq_params->sb_size;
          const int mi_count_in_sb =
              mi_size_wide[sb_size] * mi_size_high[sb_size];

          AOM_CHECK_MEM_ERROR(
              &ppi->error, td->src_var_info_of_4x4_sub_blocks,
              aom_malloc(sizeof(*td->src_var_info_of_4x4_sub_blocks) *
                         mi_count_in_sb));
        }

        if (ppi->cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION) {
          const int num_64x64_blocks =
              (ppi->seq_params.sb_size == BLOCK_64X64) ? 1 : 4;
          AOM_CHECK_MEM_ERROR(
              &ppi->error, td->vt64x64,
              aom_malloc(sizeof(*td->vt64x64) * num_64x64_blocks));
        }
      }
    }

    if (!is_first_pass && ppi->cpi->oxcf.row_mt == 1 && i < num_enc_workers) {
      if (i == 0) {
        for (int j = 0; j < ppi->num_fp_contexts; j++) {
          AOM_CHECK_MEM_ERROR(&ppi->error, ppi->parallel_cpi[j]->td.tctx,
                              (FRAME_CONTEXT *)aom_memalign(
                                  16, sizeof(*ppi->parallel_cpi[j]->td.tctx)));
        }
      } else {
        AOM_CHECK_MEM_ERROR(
            &ppi->error, thread_data->td->tctx,
            (FRAME_CONTEXT *)aom_memalign(16, sizeof(*thread_data->td->tctx)));
      }
    }
  }

  // Record the number of workers in encode stage multi-threading for which
  // allocation is done.
  p_mt_info->prev_num_enc_workers = num_enc_workers;
}